

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

cram_container * cram_new_container(int nrec,int nslice)

{
  cram_container *__ptr;
  cram_slice **__ptr_00;
  cram_block_compression_hdr *pcVar1;
  cram_stats *pcVar2;
  kh_s_i2i_t *pkVar3;
  long lVar4;
  
  __ptr = (cram_container *)calloc(1,0x250);
  if (__ptr != (cram_container *)0x0) {
    __ptr->curr_ref = -2;
    __ptr->max_c_rec = nslice * nrec;
    __ptr->max_rec = nrec;
    __ptr->max_slice = nslice;
    __ptr->pos_sorted = 1;
    __ptr_00 = (cram_slice **)calloc((long)nslice,8);
    __ptr->slices = __ptr_00;
    if (__ptr_00 != (cram_slice **)0x0) {
      pcVar1 = cram_new_compression_header();
      __ptr->comp_hdr = pcVar1;
      if (pcVar1 != (cram_block_compression_hdr *)0x0) {
        lVar4 = 0x23;
        do {
          pcVar2 = cram_stats_create();
          *(cram_stats **)(&__ptr->length + lVar4 * 2) = pcVar2;
          if (pcVar2 == (cram_stats *)0x0) goto LAB_0012a39c;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x3f);
        pkVar3 = (kh_s_i2i_t *)calloc(1,0x28);
        __ptr->tags_used = pkVar3;
        if (pkVar3 != (kh_s_i2i_t *)0x0) {
          __ptr->refs_used = (int *)0x0;
          return __ptr;
        }
      }
LAB_0012a39c:
      free(__ptr_00);
    }
    free(__ptr);
  }
  return (cram_container *)0x0;
}

Assistant:

cram_container *cram_new_container(int nrec, int nslice) {
    cram_container *c = calloc(1, sizeof(*c));
    enum cram_DS_ID id;

    if (!c)
	return NULL;

    c->curr_ref = -2;

    c->max_c_rec = nrec * nslice;
    c->curr_c_rec = 0;

    c->max_rec = nrec;
    c->record_counter = 0;
    c->num_bases = 0;

    c->max_slice = nslice;
    c->curr_slice = 0;

    c->pos_sorted = 1;
    c->max_apos   = 0;
    c->multi_seq  = 0;

    c->bams = NULL;

    if (!(c->slices = (cram_slice **)calloc(nslice, sizeof(cram_slice *))))
	goto err;
    c->slice = NULL;

    if (!(c->comp_hdr = cram_new_compression_header()))
	goto err;
    c->comp_hdr_block = NULL;

    for (id = DS_RN; id < DS_TN; id++)
	if (!(c->stats[id] = cram_stats_create())) goto err;
    
    //c->aux_B_stats = cram_stats_create();

    if (!(c->tags_used = kh_init(s_i2i)))
	goto err;
    c->refs_used = 0;

    return c;

 err:
    if (c) {
	if (c->slices)
	    free(c->slices);
	free(c);
    }
    return NULL;
}